

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall Assimp::ColladaLoader::StoreSceneCameras(ColladaLoader *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiCamera **ppaVar5;
  iterator __first;
  iterator __last;
  aiScene *pScene_local;
  ColladaLoader *this_local;
  
  sVar3 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(&this->mCameras);
  pScene->mNumCameras = (uint)sVar3;
  bVar2 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::empty(&this->mCameras);
  if (!bVar2) {
    sVar3 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(&this->mCameras);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiCamera **)operator_new__(uVar4);
    pScene->mCameras = ppaVar5;
    __first = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::begin(&this->mCameras);
    __last = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::end(&this->mCameras);
    std::
    copy<__gnu_cxx::__normal_iterator<aiCamera**,std::vector<aiCamera*,std::allocator<aiCamera*>>>,aiCamera**>
              ((__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                )__first._M_current,
               (__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                )__last._M_current,pScene->mCameras);
    std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::clear(&this->mCameras);
  }
  return;
}

Assistant:

void ColladaLoader::StoreSceneCameras( aiScene* pScene) {
    pScene->mNumCameras = static_cast<unsigned int>(mCameras.size());
    if( mCameras.empty() ) {
        return;
    }
    pScene->mCameras = new aiCamera*[mCameras.size()];
    std::copy( mCameras.begin(), mCameras.end(), pScene->mCameras);
    mCameras.clear();
}